

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O1

EGLDisplay eglu::getDisplay(NativeDisplay *nativeDisplay)

{
  Capability CVar1;
  EGLenum EVar2;
  pointer pbVar3;
  pointer pbVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  undefined4 extraout_var_00;
  EGLDisplay pvVar9;
  TestError *pTVar10;
  EGLDisplay in_RCX;
  char *__s;
  pointer_____offset_0x10___ *ppuVar11;
  bool bVar12;
  vector<int,_std::allocator<int>_> legacyAttribs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  platformExts;
  allocator<char> local_91;
  vector<int,_std::allocator<int>_> local_90;
  pointer local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50 [2];
  long local_40 [2];
  eglu *this;
  
  iVar5 = (*nativeDisplay->_vptr_NativeDisplay[2])();
  this = (eglu *)CONCAT44(extraout_var,iVar5);
  CVar1 = nativeDisplay->m_capabilities;
  if ((CVar1 & (CAPABILITY_GET_DISPLAY_PLATFORM|CAPABILITY_GET_DISPLAY_LEGACY)) == 0) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              ((InternalError *)pTVar10,(char *)0x0,
               "supportsLegacyGetDisplay || supportsPlatformGetDisplay",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0xeb);
  }
  else {
    if ((CVar1 & CAPABILITY_GET_DISPLAY_PLATFORM) != 0) {
      getExtensions_abi_cxx11_(&local_68,this,(Library *)0x0,in_RCX);
      pbVar4 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"EGL_EXT_platform_base","");
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (pbVar3,pbVar4,&local_90);
      if (_Var7._M_current == pbVar4) {
        bVar12 = false;
      }
      else {
        __s = (char *)(nativeDisplay->m_platformExtension)._M_string_length;
        if (__s != (char *)0x0) {
          __s = (nativeDisplay->m_platformExtension)._M_dataplus._M_p;
        }
        local_70 = local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_91);
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_70,local_68.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,local_50);
        bVar12 = _Var8._M_current !=
                 local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      if ((_Var7._M_current != pbVar4) && (local_50[0] != local_40)) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((pointer *)
          local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if (bVar12) {
        iVar5 = (*nativeDisplay->_vptr_NativeDisplay[5])(nativeDisplay);
        toLegacyAttribList(&local_90,(EGLAttrib *)CONCAT44(extraout_var_00,iVar5));
        EVar2 = nativeDisplay->m_platformType;
        iVar5 = (*nativeDisplay->_vptr_NativeDisplay[4])(nativeDisplay);
        pvVar9 = (EGLDisplay)
                 (**(code **)(*(long *)this + 0x108))
                           (this,EVar2,iVar5,
                            local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
        dVar6 = (**(code **)(*(long *)this + 0xf8))(this);
        checkError(dVar6,"eglGetPlatformDisplayEXT()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                   ,0xf9);
        if (pvVar9 == (EGLDisplay)0x0) {
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar10,(char *)0x0,"display != EGL_NO_DISPLAY",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                     ,0xfa);
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if ((pointer *)
            local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == (pointer *)0x0) {
          return pvVar9;
        }
        operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return pvVar9;
      }
    }
    if ((CVar1 & CAPABILITY_GET_DISPLAY_LEGACY) != 0) {
      iVar5 = (*nativeDisplay->_vptr_NativeDisplay[3])(nativeDisplay);
      pvVar9 = (EGLDisplay)(**(code **)(*(long *)this + 0xf0))(this,iVar5);
      dVar6 = (**(code **)(*(long *)this + 0xf8))(this);
      checkError(dVar6,"eglGetDisplay()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0xff);
      if (pvVar9 != (EGLDisplay)0x0) {
        return pvVar9;
      }
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,(char *)0x0,"display != EGL_NO_DISPLAY",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x100);
      ppuVar11 = &tcu::TestError::typeinfo;
      goto LAB_00360e66;
    }
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              ((InternalError *)pTVar10,"No supported way to get EGL display",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x103);
  }
  ppuVar11 = &tcu::InternalError::typeinfo;
LAB_00360e66:
  __cxa_throw(pTVar10,ppuVar11,tcu::Exception::~Exception);
}

Assistant:

EGLDisplay getDisplay (NativeDisplay& nativeDisplay)
{
	const Library&	egl								= nativeDisplay.getLibrary();
	const bool		supportsLegacyGetDisplay		= (nativeDisplay.getCapabilities() & NativeDisplay::CAPABILITY_GET_DISPLAY_LEGACY) != 0;
	const bool		supportsPlatformGetDisplay		= (nativeDisplay.getCapabilities() & NativeDisplay::CAPABILITY_GET_DISPLAY_PLATFORM) != 0;
	bool			usePlatformExt					= false;
	EGLDisplay		display							= EGL_NO_DISPLAY;

	TCU_CHECK_INTERNAL(supportsLegacyGetDisplay || supportsPlatformGetDisplay);

	if (supportsPlatformGetDisplay)
	{
		const vector<string> platformExts = getClientExtensions(egl);
		usePlatformExt = de::contains(platformExts.begin(), platformExts.end(), string("EGL_EXT_platform_base")) &&
						 de::contains(platformExts.begin(), platformExts.end(), string(nativeDisplay.getPlatformExtensionName()));
	}

	if (usePlatformExt)
	{
		const vector<EGLint>	legacyAttribs	= toLegacyAttribList(nativeDisplay.getPlatformAttributes());

		display = egl.getPlatformDisplayEXT(nativeDisplay.getPlatformType(), nativeDisplay.getPlatformNative(), &legacyAttribs[0]);
		EGLU_CHECK_MSG(egl, "eglGetPlatformDisplayEXT()");
		TCU_CHECK(display != EGL_NO_DISPLAY);
	}
	else if (supportsLegacyGetDisplay)
	{
		display = egl.getDisplay(nativeDisplay.getLegacyNative());
		EGLU_CHECK_MSG(egl, "eglGetDisplay()");
		TCU_CHECK(display != EGL_NO_DISPLAY);
	}
	else
		throw tcu::InternalError("No supported way to get EGL display", DE_NULL, __FILE__, __LINE__);

	DE_ASSERT(display != EGL_NO_DISPLAY);
	return display;
}